

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall
ON_Mesh::SeparateNgons(ON_Mesh *this,uint **vertex_face_map,uint ngon_index0,uint ngon_index1)

{
  bool bVar1;
  uint uVar2;
  uint local_fc;
  uint ni;
  undefined1 local_e8 [8];
  ON_MeshSeparateNgonInfo X;
  uint ngon_index1_local;
  uint ngon_index0_local;
  uint **vertex_face_map_local;
  ON_Mesh *this_local;
  
  X.m_virefpool._64_4_ = ngon_index1;
  X.m_virefpool.m_reserved0 = ngon_index0;
  uVar2 = NgonUnsignedCount(this);
  if (uVar2 < ngon_index1) {
    X.m_virefpool._64_4_ = NgonUnsignedCount(this);
  }
  if (X.m_virefpool.m_reserved0 < (uint)X.m_virefpool._64_4_) {
    ON_MeshSeparateNgonInfo::ON_MeshSeparateNgonInfo
              ((ON_MeshSeparateNgonInfo *)local_e8,this,vertex_face_map);
    bVar1 = ON_MeshSeparateNgonInfo::IsValid((ON_MeshSeparateNgonInfo *)local_e8);
    if (bVar1) {
      for (local_fc = X.m_virefpool.m_reserved0; local_fc < (uint)X.m_virefpool._64_4_;
          local_fc = local_fc + 1) {
        bVar1 = ON_MeshSeparateNgonInfo::FindSharedNgonVertices
                          ((ON_MeshSeparateNgonInfo *)local_e8,local_fc);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_00757b19;
        }
      }
      if (X.m_ngon_vmap._4_4_ < X.m_face_count) {
        ON_MeshSeparateNgonInfo::DuplicateSharedNgonVertices((ON_MeshSeparateNgonInfo *)local_e8);
      }
      uVar2 = VertexUnsignedCount(this);
      this_local._7_1_ = X.m_ngon_vmap._4_4_ < uVar2;
    }
    else {
      this_local._7_1_ = false;
    }
LAB_00757b19:
    ON_MeshSeparateNgonInfo::~ON_MeshSeparateNgonInfo((ON_MeshSeparateNgonInfo *)local_e8);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Mesh::SeparateNgons(
  unsigned int** vertex_face_map,
  unsigned int ngon_index0,
  unsigned int ngon_index1
  )
{
  if ( ngon_index1 > NgonUnsignedCount() )
    ngon_index1 = NgonUnsignedCount();
  if ( ngon_index1 <= ngon_index0 )
    return false;

  ON_MeshSeparateNgonInfo X(this,vertex_face_map);
  if ( false == X.IsValid() )
    return false;

  // Count number of new vertices that are required
  // to separate the ngons and save a list of what
  // needs to be updated in "X".  This loop modifies
  // vertex_face_map[] by removing references
  // to faces of vertices that will be duplicated.
  for ( unsigned int ni = ngon_index0; ni < ngon_index1; ni++ )
  {
    if( false == X.FindSharedNgonVertices(ni) )
      return 0;
  }

  // Add new vertices to ngons.
  if ( X.m_vertex_count1 > X.m_vertex_count0 )
  {
    // Duplicate the shared vertices and update the
    // ngon and face vertex index lists to reference
    // the duplicated vertices.
    X.DuplicateSharedNgonVertices();
  }

  return (VertexUnsignedCount() > X.m_vertex_count0);
}